

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getVolume(Snapshot *this)

{
  double dVar1;
  
  if (this->hasVolume == false) {
    dVar1 = SquareMatrix3<double>::determinant(&(this->frameData).hmat);
    (this->frameData).volume = dVar1;
    this->hasVolume = true;
  }
  return (this->frameData).volume;
}

Assistant:

RealType Snapshot::getVolume() {
    if (!hasVolume) {
      frameData.volume = frameData.hmat.determinant();
      hasVolume        = true;
    }
    return frameData.volume;
  }